

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * jsonnet::internal::lex_number
                   (string *__return_storage_ptr__,char **c,string *filename,Location *begin)

{
  char cVar1;
  byte bVar2;
  StaticError *pSVar3;
  undefined4 uVar4;
  stringstream ss;
  string local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined1 local_1b8 [392];
  
  local_1c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    switch(uVar4) {
    case 0:
      if (9 < (byte)(**c - 0x30U)) {
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"couldn\'t lex number","");
        StaticError::StaticError(pSVar3,filename,begin,(string *)local_1b8);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      uVar4 = *(undefined4 *)(&DAT_0016a168 + (ulong)(byte)(**c - 0x30U) * 4);
      break;
    case 1:
      cVar1 = **c;
      if (cVar1 == '.') {
LAB_0015f54c:
        uVar4 = 3;
      }
      else {
        if ((cVar1 != 'e') && (cVar1 != 'E')) {
          return __return_storage_ptr__;
        }
LAB_0015f500:
        uVar4 = 5;
      }
      break;
    case 2:
      bVar2 = **c;
      if (9 < bVar2 - 0x30) {
        if (bVar2 == 0x2e) goto LAB_0015f54c;
        if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
          return __return_storage_ptr__;
        }
        goto LAB_0015f500;
      }
      uVar4 = 2;
      break;
    case 3:
      uVar4 = 4;
      if (9 < (byte)(**c - 0x30U)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"couldn\'t lex number, junk after decimal point: ",
                   0x2f);
        local_1e0._M_dataplus._M_p._0_1_ = **c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar3,filename,begin,&local_1e0);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      break;
    case 4:
      bVar2 = **c;
      if (bVar2 - 0x30 < 10) {
        uVar4 = 4;
      }
      else {
        uVar4 = 5;
        if ((bVar2 != 0x45) && (bVar2 != 0x65)) {
          return __return_storage_ptr__;
        }
      }
      break;
    case 5:
      bVar2 = **c - 0x2b;
      if ((0xe < bVar2) || ((0x7fe5U >> (bVar2 & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"couldn\'t lex number, junk after \'E\': ",0x25);
        local_1e0._M_dataplus._M_p._0_1_ = **c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar3,filename,begin,&local_1e0);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      uVar4 = *(undefined4 *)(&DAT_0016a190 + (ulong)bVar2 * 4);
      break;
    case 6:
      uVar4 = 7;
      if (9 < (byte)(**c - 0x30U)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"couldn\'t lex number, junk after exponent sign: ",
                   0x2f);
        local_1e0._M_dataplus._M_p._0_1_ = **c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
        pSVar3 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar3,filename,begin,&local_1e0);
        __cxa_throw(pSVar3,&StaticError::typeinfo,StaticError::~StaticError);
      }
      break;
    case 7:
      uVar4 = 7;
      if (9 < (byte)(**c - 0x30U)) {
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    *c = *c + 1;
  } while( true );
}

Assistant:

std::string lex_number(const char *&c, const std::string &filename, const Location &begin)
{
    // This function should be understood with reference to the linked image:
    // https://www.json.org/img/number.png

    // Note, we deviate from the json.org documentation as follows:
    // There is no reason to lex negative numbers as atomic tokens, it is better to parse them
    // as a unary operator combined with a numeric literal.  This avoids x-1 being tokenized as
    // <identifier> <number> instead of the intended <identifier> <binop> <number>.

    enum State {
        BEGIN,
        AFTER_ZERO,
        AFTER_ONE_TO_NINE,
        AFTER_DOT,
        AFTER_DIGIT,
        AFTER_E,
        AFTER_EXP_SIGN,
        AFTER_EXP_DIGIT
    } state;

    std::string r;

    state = BEGIN;
    while (true) {
        switch (state) {
            case BEGIN:
                switch (*c) {
                    case '0': state = AFTER_ZERO; break;

                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: throw StaticError(filename, begin, "couldn't lex number");
                }
                break;

            case AFTER_ZERO:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    default: goto end;
                }
                break;

            case AFTER_ONE_TO_NINE:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: goto end;
                }
                break;

            case AFTER_DOT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after decimal point: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_DIGIT:
                switch (*c) {
                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: goto end;
                }
                break;

            case AFTER_E:
                switch (*c) {
                    case '+':
                    case '-': state = AFTER_EXP_SIGN; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after 'E': " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_SIGN:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after exponent sign: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_DIGIT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: goto end;
                }
                break;
        }
        r += *c;
        c++;
    }
end:
    return r;
}